

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcdgen.h
# Opt level: O2

void __thiscall
VcdGen::TickData::append(TickData *this,tuple<unsigned_long,_unsigned_int> *data,Signal *signal)

{
  value_type local_20;
  
  local_20.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>.
  super__Tuple_impl<1UL,_unsigned_int,_const_VcdGen::Signal_*>.
  super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
       (data->super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>).
       super__Tuple_impl<1UL,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
  local_20.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (data->super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>).
       super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
  local_20.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>.
  super__Tuple_impl<1UL,_unsigned_int,_const_VcdGen::Signal_*>.
  super__Tuple_impl<2UL,_const_VcdGen::Signal_*>.
  super__Head_base<2UL,_const_VcdGen::Signal_*,_false>._M_head_impl =
       (_Head_base<2UL,_const_VcdGen::Signal_*,_false>)
       (_Head_base<2UL,_const_VcdGen::Signal_*,_false>)signal;
  std::
  vector<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
  ::push_back(&this->tick_data_,&local_20);
  return;
}

Assistant:

void append(tuple<uint64_t, uint32_t> data, const Signal* signal){
        auto tmp = make_tuple(get<0>(data), get<1>(data), signal);
        this->append(tmp);
    }